

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void __thiscall JsonParser_deserialize_map_Test::TestBody(JsonParser_deserialize_map_Test *this)

{
  double dVar1;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> in_text;
  bool bVar2;
  char *pcVar3;
  object *poVar4;
  AssertHelper local_260 [8];
  Message local_258 [15];
  allocator<char8_t> local_249;
  u8string local_248 [32];
  undefined1 local_228 [8];
  AssertionResult gtest_ar_6;
  Message local_210 [15];
  allocator<char8_t> local_201;
  u8string local_200 [32];
  undefined1 local_1e0 [8];
  AssertionResult gtest_ar_5;
  Message local_1c8 [15];
  allocator<char8_t> local_1b9;
  u8string local_1b8 [32];
  undefined1 local_198 [8];
  AssertionResult gtest_ar_4;
  Message local_180 [8];
  int local_178;
  allocator<char8_t> local_171;
  u8string local_170 [32];
  undefined1 local_150 [8];
  AssertionResult gtest_ar_3;
  Message local_138 [14];
  bool local_12a;
  allocator<char8_t> local_129;
  u8string local_128 [32];
  undefined1 local_108 [8];
  AssertionResult gtest_ar_2;
  Message local_f0 [14];
  bool local_e2;
  allocator<char8_t> local_e1;
  u8string local_e0 [32];
  undefined1 local_c0 [8];
  AssertionResult gtest_ar_1;
  Message local_a8 [8];
  uint local_a0 [4];
  unsigned_long local_90;
  undefined1 local_88 [8];
  AssertionResult gtest_ar;
  undefined1 local_68 [8];
  object obj;
  u8string_view json_data;
  json_parser parser;
  JsonParser_deserialize_map_Test *this_local;
  
  jessilib::json_parser::json_parser((json_parser *)&json_data._M_str);
  obj.m_value.
  super__Variant_base<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<jessilib::object,_std::allocator<jessilib::object>_>,_std::map<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object,_std::less<std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char8_t,_std::char_traits<char8_t>,_std::allocator<char8_t>_>,_jessilib::object>_>_>_>
  .
  super__Move_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Copy_assign_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Move_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Copy_ctor_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  .
  super__Variant_storage_alias<void_*,_bool,_long,_long_double,_std::__cxx11::basic_string<char8_t>,_std::vector<unsigned_char>,_std::vector<jessilib::object>,_std::map<std::__cxx11::basic_string<char8_t>,_jessilib::object>_>
  ._56_8_ = 0x94;
  json_data._M_len = (size_t)anon_var_dwarf_1a35c9;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x94;
  in_text._M_str =
       "{\n\t\t\"some_true\":true,\n\t\t\"some_false\"\t:  false,\n\t\t\"some_int\": 1234,\n\t\t\"some_double\" : 12.34,\n\t\t\"some_other_double\" :0.1234,\n\t\t\"some_text\" : \"text\"\n\t}"
  ;
  in_text._M_len = 0x94;
  jessilib::parser::deserialize<char8_t>((object *)local_68,(parser *)&json_data._M_str,in_text);
  local_90 = jessilib::object::size();
  local_a0[0] = 6;
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
            ((EqHelper *)local_88,"obj.size()","6U",&local_90,local_a0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_88);
  if (!bVar2) {
    testing::Message::Message(local_a8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_88);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0xe5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_88);
  std::allocator<char8_t>::allocator(&local_e1);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>(local_e0,"some_true",&local_e1);
  poVar4 = (object *)jessilib::object::operator[]((u8string *)local_68);
  local_e2 = true;
  testing::internal::EqHelper::Compare<jessilib::object,_bool,_nullptr>
            ((EqHelper *)local_c0,"obj[u8\"some_true\"]","true",poVar4,&local_e2);
  std::__cxx11::u8string::~u8string(local_e0);
  std::allocator<char8_t>::~allocator(&local_e1);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_c0);
  if (!bVar2) {
    testing::Message::Message(local_f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_c0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0xe6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_c0);
  std::allocator<char8_t>::allocator(&local_129);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>(local_128,"some_false",&local_129);
  poVar4 = (object *)jessilib::object::operator[]((u8string *)local_68);
  local_12a = false;
  testing::internal::EqHelper::Compare<jessilib::object,_bool,_nullptr>
            ((EqHelper *)local_108,"obj[u8\"some_false\"]","false",poVar4,&local_12a);
  std::__cxx11::u8string::~u8string(local_128);
  std::allocator<char8_t>::~allocator(&local_129);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar2) {
    testing::Message::Message(local_138);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0xe7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  std::allocator<char8_t>::allocator(&local_171);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>(local_170,"some_int",&local_171);
  poVar4 = (object *)jessilib::object::operator[]((u8string *)local_68);
  local_178 = 0x4d2;
  testing::internal::EqHelper::Compare<jessilib::object,_int,_nullptr>
            ((EqHelper *)local_150,"obj[u8\"some_int\"]","1234",poVar4,&local_178);
  std::__cxx11::u8string::~u8string(local_170);
  std::allocator<char8_t>::~allocator(&local_171);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
  if (!bVar2) {
    testing::Message::Message(local_180);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0xe8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,local_180);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
  std::allocator<char8_t>::allocator(&local_1b9);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>(local_1b8,"some_double",&local_1b9);
  poVar4 = (object *)jessilib::object::operator[]((u8string *)local_68);
  dVar1 = jessilib::object::get<double,_nullptr>(poVar4,0.0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_198,"obj[u8\"some_double\"].get<double>()","12.34",dVar1,12.34);
  std::__cxx11::u8string::~u8string(local_1b8);
  std::allocator<char8_t>::~allocator(&local_1b9);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_198);
  if (!bVar2) {
    testing::Message::Message(local_1c8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_198);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0xe9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(local_1c8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_198);
  std::allocator<char8_t>::allocator(&local_201);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>
            (local_200,"some_other_double",&local_201);
  poVar4 = (object *)jessilib::object::operator[]((u8string *)local_68);
  dVar1 = jessilib::object::get<double,_nullptr>(poVar4,0.0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_1e0,"obj[u8\"some_other_double\"].get<double>()","0.1234",dVar1,
             0.1234);
  std::__cxx11::u8string::~u8string(local_200);
  std::allocator<char8_t>::~allocator(&local_201);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1e0);
  if (!bVar2) {
    testing::Message::Message(local_210);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0xea,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(local_210);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1e0);
  std::allocator<char8_t>::allocator(&local_249);
  std::__cxx11::u8string::u8string<std::allocator<char8_t>>(local_248,"some_text",&local_249);
  poVar4 = (object *)jessilib::object::operator[]((u8string *)local_68);
  testing::internal::EqHelper::Compare<jessilib::object,_char8_t[5],_nullptr>
            ((EqHelper *)local_228,"obj[u8\"some_text\"]","u8\"text\"",poVar4,
             (char8_t (*) [5])0x692482);
  std::__cxx11::u8string::~u8string(local_248);
  std::allocator<char8_t>::~allocator(&local_249);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar2) {
    testing::Message::Message(local_258);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              (local_260,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/parsers/json.cpp"
               ,0xeb,pcVar3);
    testing::internal::AssertHelper::operator=(local_260,local_258);
    testing::internal::AssertHelper::~AssertHelper(local_260);
    testing::Message::~Message(local_258);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  jessilib::object::~object((object *)local_68);
  return;
}

Assistant:

TEST(JsonParser, deserialize_map) {
	json_parser parser;

	constexpr std::u8string_view json_data = u8R"json({
		"some_true":true,
		"some_false"	:  false,
		"some_int": 1234,
		"some_double" : 12.34,
		"some_other_double" :0.1234,
		"some_text" : "text"
	})json"sv;

	object obj = parser.deserialize(json_data);
	EXPECT_EQ(obj.size(), 6U);
	EXPECT_EQ(obj[u8"some_true"], true);
	EXPECT_EQ(obj[u8"some_false"], false);
	EXPECT_EQ(obj[u8"some_int"], 1234);
	EXPECT_DOUBLE_EQ(obj[u8"some_double"].get<double>(), 12.34);
	EXPECT_DOUBLE_EQ(obj[u8"some_other_double"].get<double>(), 0.1234);
	EXPECT_EQ(obj[u8"some_text"], u8"text");
}